

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorType.cpp
# Opt level: O0

OperatorKey * Kernel::OperatorType::setupKey(uint arity,TermList *sorts)

{
  Vector<Kernel::TermList> *this;
  TermList TVar1;
  TermList *pTVar2;
  ulong uVar3;
  long in_RSI;
  uint in_EDI;
  uint i_1;
  uint i;
  OperatorKey *key;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint uVar4;
  uint local_1c;
  
  this = Lib::Vector<Kernel::TermList>::allocate
                   (CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (in_RSI == 0) {
    for (local_1c = 0; local_1c < in_EDI; local_1c = local_1c + 1) {
      TVar1 = AtomicSort::defaultSort();
      pTVar2 = Lib::Vector<Kernel::TermList>::operator[](this,(ulong)local_1c);
      pTVar2->_content = TVar1._content;
    }
  }
  else {
    for (uVar4 = 0; uVar4 < in_EDI; uVar4 = uVar4 + 1) {
      uVar3 = (ulong)uVar4;
      pTVar2 = Lib::Vector<Kernel::TermList>::operator[](this,(ulong)uVar4);
      pTVar2->_content = *(uint64_t *)(in_RSI + uVar3 * 8);
    }
  }
  return this;
}

Assistant:

OperatorType::OperatorKey* OperatorType::setupKey(unsigned arity, const TermList* sorts)
{
  OperatorKey* key = OperatorKey::allocate(arity+1);

  if (!sorts) {
    // initialise all argument types to the default type
    for (unsigned i=0; i < arity; i++) {
      (*key)[i] = AtomicSort::defaultSort();
    }
  } else {
    // initialise all the argument types to those taken from sorts
    for (unsigned i = 0; i < arity; i++) {
      ASS(sorts[i].isVar() || sorts[i].term()->isSort());
      (*key)[i] = sorts[i];
    }
  }
  return key;
}